

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

void Sfm_CreateLevel(Vec_Wec_t *vFanins,Vec_Int_t *vLevels,Vec_Str_t *vEmpty)

{
  int iVar1;
  Vec_Int_t *vArray;
  int i;
  
  if (vLevels->nSize == 0) {
    Vec_IntFill(vLevels,vFanins->nSize,0);
    for (i = 0; i < vFanins->nSize; i = i + 1) {
      vArray = Vec_WecEntry(vFanins,i);
      iVar1 = Sfm_ObjAddsLevelArray(vEmpty,i);
      iVar1 = Sfm_ObjLevelNew(vArray,vLevels,iVar1);
      Vec_IntWriteEntry(vLevels,i,iVar1);
    }
    return;
  }
  __assert_fail("Vec_IntSize(vLevels) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                ,0x7a,"void Sfm_CreateLevel(Vec_Wec_t *, Vec_Int_t *, Vec_Str_t *)");
}

Assistant:

void Sfm_CreateLevel( Vec_Wec_t * vFanins, Vec_Int_t * vLevels, Vec_Str_t * vEmpty )
{
    Vec_Int_t * vArray;
    int i;
    assert( Vec_IntSize(vLevels) == 0 );
    Vec_IntFill( vLevels, Vec_WecSize(vFanins), 0 );
    Vec_WecForEachLevel( vFanins, vArray, i )
        Vec_IntWriteEntry( vLevels, i, Sfm_ObjLevelNew(vArray, vLevels, Sfm_ObjAddsLevelArray(vEmpty, i)) );
}